

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::checkIdUsed(CheckerVisitor *this,Id *id,Node *p,ValueRef *v)

{
  SymbolInfo *pSVar1;
  byte bVar2;
  TreeOp TVar3;
  BinExpr *bin;
  char cVar4;
  bool bVar5;
  PredicateCheckerVisitor local_50;
  
  if (p == (Node *)0x0) {
LAB_0014f2d6:
    bVar5 = v->assigned;
    pSVar1 = v->info;
    pSVar1->used = true;
    if (bVar5 != true) goto LAB_0014f32d;
LAB_0014f2ea:
    pSVar1->usedAfterAssign = true;
LAB_0014f2ee:
    bVar5 = false;
  }
  else {
    TVar3 = p->_op;
    if (TVar3 == TO_EXPR_STMT) {
      p = (Node *)p[1].super_ArenaObj._vptr_ArenaObj;
      cVar4 = v->assigned;
      if (p == (Node *)0x0) {
        pSVar1 = v->info;
        pSVar1->used = true;
        if ((bool)cVar4 == false) goto LAB_0014f32d;
        goto LAB_0014f2ea;
      }
      TVar3 = p->_op;
    }
    else {
      if (0x34 < TVar3 - TO_ID) goto LAB_0014f2d6;
      cVar4 = v->assigned;
    }
    if (((TVar3 - TO_PLUSEQ < 5) || (TVar3 == TO_ASSIGN)) &&
       ((Id *)p[1].super_ArenaObj._vptr_ArenaObj == id)) {
      pSVar1 = v->info;
      bVar2 = 1;
      if (pSVar1->usedAfterAssign == false) {
        local_50.deepCheck = true;
        local_50.result = false;
        local_50.super_Visitor._vptr_Visitor = (_func_int **)&PTR__Visitor_001a4240;
        local_50.checkee = (Node *)id;
        Node::visit<SQCompilation::PredicateCheckerVisitor>(*(Node **)&p[1]._coordinates,&local_50);
        pSVar1 = v->info;
        bVar2 = local_50.result;
      }
      pSVar1->used = (bool)(pSVar1->used | bVar2);
      v->assigned = true;
      v->lastAssigneeScope = this->currentScope;
      pSVar1->usedAfterAssign = false;
      if (TVar3 == TO_ASSIGN) {
        return;
      }
    }
    pSVar1 = v->info;
    pSVar1->used = true;
    if (cVar4 == '\0') goto LAB_0014f32d;
    pSVar1->usedAfterAssign = true;
    if ((int)p->_op < 0x2c) goto LAB_0014f2ee;
    bVar5 = p->_op < TO_NOT;
  }
  v->assigned = bVar5;
LAB_0014f32d:
  if (v->state == VRS_UNDEFINED) {
    report(this,(Node *)id,0x86);
  }
  else if (v->state == VRS_PARTIALLY) {
    report(this,(Node *)id,0x85,id->_id);
  }
  return;
}

Assistant:

void CheckerVisitor::checkIdUsed(const Id *id, const Node *p, ValueRef *v) {
  const Expr *e = nullptr;
  if (p) {
    if (p->op() == TO_EXPR_STMT)
      e = static_cast<const ExprStatement *>(p)->expression();
    else if (p->isExpression())
      e = p->asExpression();
  }

  bool assigned = v->assigned;

  if (e && isAssignExpr(e)) {
    const BinExpr *bin = static_cast<const BinExpr *>(e);
    const Expr *lhs = bin->lhs();
    Expr *rhs = bin->rhs();
    bool simpleAsgn = e->op() == TO_ASSIGN;
    if (id == lhs) {
      bool used = v->info->usedAfterAssign || existsInTree(id, rhs);
      //if (!used && assigned && simpleAsgn) {
      //  if (!v->lastAssigneeScope || currentScope->owner == v->lastAssigneeScope->owner)
      //    report(bin, DiagnosticsId::DI_REASSIGN_WITH_NO_USAGE);
      //}
      v->info->used |= used;
      v->assigned = true;
      v->lastAssigneeScope = currentScope;
      v->info->usedAfterAssign = false;
      if (simpleAsgn)
        return;
    }
  }

  // it's usage
  v->info->used = true;
  if (assigned) {
    v->info->usedAfterAssign = true;
    v->assigned = e ? TO_PLUSEQ <= e->op() && e->op() <= TO_MODEQ : false;
  }

  if (v->state == VRS_PARTIALLY) {
    report(id, DiagnosticsId::DI_POSSIBLE_GARBAGE, id->id());
  }
  else if (v->state == VRS_UNDEFINED) {
    report(id, DiagnosticsId::DI_UNINITIALIZED_VAR);
  }
}